

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_id(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  int iVar3;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  if (strm->avail_in < (ulong)strm->state->in_blklen) {
    uVar2 = bits_ask(strm,piVar1->id_len);
    if (uVar2 == 0) {
      piVar1->mode = m_id;
      return 0;
    }
    uVar2 = bits_get(strm,piVar1->id_len);
    piVar1->id = uVar2;
    bits_drop(strm,piVar1->id_len);
  }
  else {
    uVar2 = direct_get(strm,piVar1->id_len);
    piVar1->id = uVar2;
  }
  piVar1->mode = piVar1->id_table[piVar1->id];
  iVar3 = (*piVar1->mode)(strm);
  return iVar3;
}

Assistant:

static inline int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (strm->avail_in >= strm->state->in_blklen) {
        state->id = direct_get(strm, state->id_len);
    } else {
        if (bits_ask(strm, state->id_len) == 0) {
            state->mode = m_id;
            return M_EXIT;
        }
        state->id = bits_get(strm, state->id_len);
        bits_drop(strm, state->id_len);
    }
    state->mode = state->id_table[state->id];
    return(state->mode(strm));
}